

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall Memory::Recycler::ClearTrackAllocInfo(Recycler *this,TrackAllocData *data)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  TrackAllocData *data_local;
  Recycler *this_local;
  
  if (this->trackerDictionary != (TypeInfotoTrackerItemMap *)0x0) {
    bVar2 = TrackAllocData::IsEmpty(&this->nextAllocData);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x1fbe,"(!nextAllocData.IsEmpty())",
                         "Missing tracking information for this allocation, are you not using the macros?"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    if (data != (TrackAllocData *)0x0) {
      memcpy(data,&this->nextAllocData,0x28);
    }
    TrackAllocData::Clear(&this->nextAllocData);
  }
  return;
}

Assistant:

void
Recycler::ClearTrackAllocInfo(TrackAllocData* data/* = NULL*/)
{
#ifdef PROFILE_RECYCLER_ALLOC
    if (this->trackerDictionary != nullptr)
    {
        AssertMsg(!nextAllocData.IsEmpty(), "Missing tracking information for this allocation, are you not using the macros?");
        if (data)
        {
            *data = nextAllocData;
        }
        nextAllocData.Clear();
    }
#endif
}